

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::MarkObjectSlots_TTD
          (PathTypeHandlerBase *this,SnapshotExtractor *extractor,DynamicObject *obj)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  PropertyRecord *pPVar3;
  Var var;
  byte bVar4;
  ulong uVar5;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  iVar2 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  if (1 < uVar1) {
    uVar5 = 0;
    do {
      pPVar3 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,(int)uVar5);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        bVar4 = 0;
      }
      else {
        bVar4 = (*(byte *)(CONCAT44(extraout_var,iVar2) + uVar5) & 8) >> 3;
      }
      if ((0x10 < pPVar3->pid + 1U) && (bVar4 == 0)) {
        var = DynamicObject::GetSlot(obj,(int)uVar5);
        TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 >> 1 != uVar5);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MarkObjectSlots_TTD(TTD::SnapshotExtractor* extractor, DynamicObject* obj) const
    {
        uint32 plength = this->GetPathLength();
        ObjectSlotAttributes * attributes = this->GetAttributeArray();

        for(uint32 index = 0; index < plength; ++index)
        {
            Js::PropertyId pid = GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId();
            ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;

            if (!DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid) || (attr & ObjectSlotAttr_Deleted))
            {
                continue;
            }

            Js::Var value = obj->GetSlot(index);
            extractor->MarkVisitVar(value);
        }
    }